

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ushort uVar1;
  int iVar2;
  float *pfVar3;
  unsigned_short *puVar4;
  float fVar5;
  float fVar6;
  ImWchar IVar7;
  undefined2 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  float *pfVar13;
  ImFontGlyph *pIVar14;
  ImFontGlyph *pIVar15;
  char *__function;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  
  uVar20 = (this->Glyphs).Size;
  if ((ulong)uVar20 == 0) {
    uVar21 = 1;
  }
  else {
    uVar21 = 0;
    uVar18 = 0;
    if (0 < (int)uVar20) {
      uVar18 = uVar20;
    }
    if (uVar18 <= uVar20 - 1) {
      __function = "value_type &ImVector<ImFontGlyph>::operator[](int) [T = ImFontGlyph]";
      goto LAB_001aaaba;
    }
    lVar16 = 0;
    do {
      uVar1 = *(ushort *)((long)&((this->Glyphs).Data)->Codepoint + lVar16);
      uVar18 = (uint)uVar1;
      if (uVar1 < uVar21) {
        uVar18 = uVar21;
      }
      uVar21 = uVar18;
      lVar16 = lVar16 + 0x28;
    } while ((ulong)uVar20 * 0x28 != lVar16);
    if (0xfffe < (int)uVar20) {
      __assert_fail("Glyphs.Size < 0xFFFF",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                    ,0x8ad,"void ImFont::BuildLookupTable()");
    }
    uVar21 = uVar21 + 1;
  }
  pfVar3 = (this->IndexAdvanceX).Data;
  if (pfVar3 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar3);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  puVar4 = (this->IndexLookup).Data;
  if (puVar4 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar4);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  GrowIndex(this,uVar21);
  uVar20 = (this->Glyphs).Size;
  uVar19 = (ulong)uVar20;
  if (0 < (int)uVar20) {
    iVar12 = (this->IndexAdvanceX).Size;
    pfVar3 = (this->IndexAdvanceX).Data;
    iVar2 = (this->IndexLookup).Size;
    puVar4 = (this->IndexLookup).Data;
    pfVar13 = &((this->Glyphs).Data)->AdvanceX;
    uVar17 = 0;
    do {
      if (iVar12 <= (int)(uint)((ImFontGlyph *)(pfVar13 + -1))->Codepoint) goto LAB_001aaa8e;
      uVar18 = (uint)((ImFontGlyph *)(pfVar13 + -1))->Codepoint;
      pfVar3[uVar18] = *pfVar13;
      if (iVar2 <= (int)uVar18) goto LAB_001aaaa5;
      puVar4[uVar18] = (unsigned_short)uVar17;
      uVar17 = uVar17 + 1;
      pfVar13 = pfVar13 + 10;
    } while (uVar19 != uVar17);
  }
  iVar12 = (this->IndexLookup).Size;
  if ((iVar12 < 0x21) || (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
    pIVar14 = this->FallbackGlyph;
  }
  else {
    pIVar14 = (ImFontGlyph *)((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar1 * 0x28))
    ;
  }
  if (pIVar14 == (ImFontGlyph *)0x0) {
LAB_001aaa14:
    if (((int)(uint)this->FallbackChar < iVar12) &&
       (uVar19 = (ulong)(this->IndexLookup).Data[this->FallbackChar], uVar19 != 0xffff)) {
      pIVar15 = (this->Glyphs).Data;
      pIVar14 = pIVar15 + uVar19;
      this->FallbackGlyph = pIVar14;
      if (pIVar15 == (ImFontGlyph *)0x0) goto LAB_001aaa50;
      fVar22 = pIVar14->AdvanceX;
    }
    else {
      this->FallbackGlyph = (ImFontGlyph *)0x0;
LAB_001aaa50:
      fVar22 = 0.0;
    }
    this->FallbackAdvanceX = fVar22;
    uVar20 = (this->IndexAdvanceX).Size;
    pfVar3 = (this->IndexAdvanceX).Data;
    uVar17 = 0;
    uVar19 = (ulong)uVar20;
    if ((int)uVar20 < 1) {
      uVar19 = uVar17;
    }
    while (uVar19 != uVar17) {
      pfVar13 = pfVar3 + uVar17;
      if (*pfVar13 <= 0.0 && *pfVar13 != 0.0) {
        pfVar3[uVar17] = fVar22;
      }
      uVar17 = uVar17 + 1;
      if (uVar21 == uVar17) {
        return;
      }
    }
  }
  else {
    if ((int)uVar20 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                    ,0x4ca,"value_type &ImVector<ImFontGlyph>::back() [T = ImFontGlyph]");
    }
    pIVar14 = (this->Glyphs).Data;
    if (pIVar14[uVar19 - 1].Codepoint != 9) {
      uVar19 = uVar19 + 1;
      iVar2 = (this->Glyphs).Capacity;
      if (iVar2 <= (int)uVar20) {
        if (iVar2 == 0) {
          uVar20 = 8;
        }
        else {
          uVar20 = iVar2 / 2 + iVar2;
        }
        uVar17 = (ulong)uVar20;
        if ((int)uVar20 <= (int)uVar19) {
          uVar17 = uVar19 & 0xffffffff;
        }
        pIVar14 = (ImFontGlyph *)ImGui::MemAlloc(uVar17 * 0x28);
        pIVar15 = (this->Glyphs).Data;
        if (pIVar15 != (ImFontGlyph *)0x0) {
          memcpy(pIVar14,pIVar15,(long)(this->Glyphs).Size * 0x28);
          ImGui::MemFree((this->Glyphs).Data);
        }
        (this->Glyphs).Data = pIVar14;
        (this->Glyphs).Capacity = (int)uVar17;
        iVar12 = (this->IndexLookup).Size;
      }
      (this->Glyphs).Size = (int)uVar19;
    }
    if ((iVar12 < 0x21) || (uVar17 = (ulong)(this->IndexLookup).Data[0x20], uVar17 == 0xffff)) {
      pIVar15 = this->FallbackGlyph;
    }
    else {
      pIVar15 = pIVar14 + uVar17;
    }
    fVar22 = pIVar15->V1;
    pIVar14[uVar19 - 1].U1 = pIVar15->U1;
    pIVar14[uVar19 - 1].V1 = fVar22;
    IVar7 = pIVar15->Codepoint;
    uVar8 = *(undefined2 *)&pIVar15->field_0x2;
    fVar9 = pIVar15->AdvanceX;
    fVar10 = pIVar15->X0;
    fVar11 = pIVar15->Y0;
    fVar22 = pIVar15->Y1;
    fVar5 = pIVar15->U0;
    fVar6 = pIVar15->V0;
    pIVar14[uVar19 - 1].X1 = pIVar15->X1;
    pIVar14[uVar19 - 1].Y1 = fVar22;
    pIVar14[uVar19 - 1].U0 = fVar5;
    pIVar14[uVar19 - 1].V0 = fVar6;
    pIVar15 = pIVar14 + (uVar19 - 1);
    pIVar15->Codepoint = IVar7;
    *(undefined2 *)&pIVar15->field_0x2 = uVar8;
    pIVar15->AdvanceX = fVar9;
    pIVar14[uVar19 - 1].X0 = fVar10;
    pIVar14[uVar19 - 1].Y0 = fVar11;
    pIVar14[uVar19 - 1].Codepoint = 9;
    fVar22 = pIVar14[uVar19 - 1].AdvanceX * 4.0;
    pIVar14[uVar19 - 1].AdvanceX = fVar22;
    if (9 < (this->IndexAdvanceX).Size) {
      (this->IndexAdvanceX).Data[9] = fVar22;
      iVar12 = (this->IndexLookup).Size;
      if (iVar12 < 10) {
LAB_001aaaa5:
        __function = "value_type &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
        goto LAB_001aaaba;
      }
      (this->IndexLookup).Data[9] = (short)(this->Glyphs).Size - 1;
      goto LAB_001aaa14;
    }
  }
LAB_001aaa8e:
  __function = "value_type &ImVector<float>::operator[](int) [T = float]";
LAB_001aaaba:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4c0,__function);
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (unsigned short)i;
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((unsigned short)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((unsigned short)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= 4;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (unsigned short)(Glyphs.Size-1);
    }

    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}